

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O0

void __thiscall
Indexing::CodeTree::Compiler<true>::handleVar
          (Compiler<true> *this,uint var,Stack<unsigned_int> *globalCounterparts)

{
  int iVar1;
  CodeOp elem;
  CodeOp elem_00;
  bool bVar2;
  CodeOp *in_RDI;
  uint *globalVarNumPtr;
  uint *varNumPtr;
  uint in_stack_ffffffffffffff9c;
  Stack<Indexing::CodeTree::CodeOp> *in_stack_ffffffffffffffa0;
  Stack<Indexing::CodeTree::CodeOp> *this_00;
  uint64_t in_stack_ffffffffffffffa8;
  uint64_t uVar3;
  undefined1 in_stack_ffffffffffffffb8 [16];
  undefined1 auVar4 [12];
  int *local_38;
  int *local_20;
  
  auVar4 = in_stack_ffffffffffffffb8._4_12_;
  bVar2 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::getValuePtr
                    (in_stack_ffffffffffffffb8._8_8_,in_stack_ffffffffffffffb8._4_4_,(uint **)in_RDI
                    );
  if (bVar2) {
    iVar1 = *(int *)&in_RDI->_alternative;
    *(int *)&in_RDI->_alternative = iVar1 + 1;
    *local_20 = iVar1;
    uVar3 = in_RDI->_content;
    CodeOp::getTermOp((Instruction)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                      (uint)in_stack_ffffffffffffffa0);
    elem._alternative = in_RDI;
    elem._content = uVar3;
    Lib::Stack<Indexing::CodeTree::CodeOp>::push(in_stack_ffffffffffffffa0,elem);
    bVar2 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::getValuePtr
                      (auVar4._4_8_,auVar4._0_4_,(uint **)in_RDI);
    if (bVar2) {
      iVar1 = *(int *)((long)&in_RDI->_alternative + 4);
      *(int *)((long)&in_RDI->_alternative + 4) = iVar1 + 1;
      *local_38 = iVar1;
    }
    Lib::Stack<unsigned_int>::push
              ((Stack<unsigned_int> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
  else {
    this_00 = (Stack<Indexing::CodeTree::CodeOp> *)in_RDI->_content;
    CodeOp::getTermOp((Instruction)((ulong)this_00 >> 0x20),(uint)this_00);
    elem_00._alternative = in_RDI;
    elem_00._content = in_stack_ffffffffffffffa8;
    Lib::Stack<Indexing::CodeTree::CodeOp>::push(this_00,elem_00);
  }
  return;
}

Assistant:

void CodeTree::Compiler<forLits>::handleVar(unsigned var, Stack<unsigned>* globalCounterparts)
{
  unsigned* varNumPtr;
  if (varMap.getValuePtr(var,varNumPtr)) {
    *varNumPtr = nextVarNum++;
    code.push(CodeOp::getTermOp(ASSIGN_VAR, *varNumPtr));

    if constexpr (forLits) {
      unsigned* globalVarNumPtr;
      if (globalVarMap.getValuePtr(var,globalVarNumPtr)) {
        *globalVarNumPtr = nextGlobalVarNum++;
      }
      globalCounterparts->push(*globalVarNumPtr);
    }
  } else {
    code.push(CodeOp::getTermOp(CHECK_VAR, *varNumPtr));
  }
}